

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

SP pbrt::remeshVertices(SP *in)

{
  mapped_type mVar1;
  mapped_type mVar2;
  ulong uVar3;
  bool bVar4;
  element_type *peVar5;
  size_type sVar6;
  reference pvVar7;
  mapped_type *pmVar8;
  pointer ppVar9;
  reference pvVar10;
  reference pvVar11;
  ostream *this;
  ostream *poVar12;
  void *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var13;
  element_type *in_RDI;
  SP SVar14;
  vec4i idx;
  iterator __end1;
  iterator __begin1;
  vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_> *__range1;
  int newID;
  iterator it;
  FatVertex oldVertex;
  size_t i;
  map<pbrt::FatVertex,_int,_std::less<pbrt::FatVertex>,_std::allocator<std::pair<const_pbrt::FatVertex,_int>_>_>
  vertexID;
  vector<int,_std::allocator<int>_> indexRemap;
  SP *out;
  value_type *in_stack_fffffffffffffe58;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
  *in_stack_fffffffffffffe60;
  value_type *in_stack_fffffffffffffe68;
  allocator_type *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  value_type w;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  value_type z;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  value_type y;
  int local_16c;
  key_type *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  vec4i local_f8;
  undefined8 local_e8;
  undefined8 local_e0;
  vec4i *local_d8;
  __normal_iterator<pbrt::math::vec4i_*,_std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>_>
  local_d0;
  vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_> *local_c8;
  mapped_type local_bc;
  _Self local_b8;
  _Self local_b0;
  vec3f local_a4;
  undefined8 local_98;
  float local_90;
  vec3f local_8c;
  ulong local_80;
  vector<int,_std::allocator<int>_> local_40;
  byte local_11;
  
  local_11 = 0;
  std::__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b614a);
  std::make_shared<pbrt::QuadMesh,std::shared_ptr<pbrt::Material>&>
            ((shared_ptr<pbrt::Material> *)
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  std::__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b616b);
  std::__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b6184);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
  ::operator=(in_stack_fffffffffffffe60,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
               *)in_stack_fffffffffffffe58);
  peVar5 = std::__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1b61a7);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::size(&peVar5->vertex);
  std::allocator<int>::allocator((allocator<int> *)0x1b61d0);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),in_stack_fffffffffffffe70
            );
  std::allocator<int>::~allocator((allocator<int> *)0x1b61fc);
  std::
  map<pbrt::FatVertex,_int,_std::less<pbrt::FatVertex>,_std::allocator<std::pair<const_pbrt::FatVertex,_int>_>_>
  ::map((map<pbrt::FatVertex,_int,_std::less<pbrt::FatVertex>,_std::allocator<std::pair<const_pbrt::FatVertex,_int>_>_>
         *)0x1b6209);
  local_80 = 0;
  while( true ) {
    uVar3 = local_80;
    peVar5 = std::__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b622f);
    sVar6 = std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::size
                      (&peVar5->vertex);
    if (sVar6 <= uVar3) break;
    peVar5 = std::__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b6259);
    pvVar7 = std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator[]
                       (&peVar5->vertex,local_80);
    local_98._0_4_ = pvVar7->x;
    local_98._4_4_ = pvVar7->y;
    local_90 = pvVar7->z;
    std::__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1b628f);
    bVar4 = std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::empty
                      ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
                       in_stack_fffffffffffffe70);
    if (bVar4) {
      math::vec3f::vec3f(&local_a4,0.0);
    }
    else {
      peVar5 = std::__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b62c5);
      pvVar7 = std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator[]
                         (&peVar5->normal,local_80);
      local_a4.x = pvVar7->x;
      local_a4.y = pvVar7->y;
      local_a4.z = pvVar7->z;
    }
    local_8c.z = local_a4.z;
    local_8c.x = local_a4.x;
    local_8c.y = local_a4.y;
    local_b0._M_node =
         (_Base_ptr)
         std::
         map<pbrt::FatVertex,_int,_std::less<pbrt::FatVertex>,_std::allocator<std::pair<const_pbrt::FatVertex,_int>_>_>
         ::find((map<pbrt::FatVertex,_int,_std::less<pbrt::FatVertex>,_std::allocator<std::pair<const_pbrt::FatVertex,_int>_>_>
                 *)in_stack_fffffffffffffe58,(key_type *)0x1b6324);
    local_b8._M_node =
         (_Base_ptr)
         std::
         map<pbrt::FatVertex,_int,_std::less<pbrt::FatVertex>,_std::allocator<std::pair<const_pbrt::FatVertex,_int>_>_>
         ::end((map<pbrt::FatVertex,_int,_std::less<pbrt::FatVertex>,_std::allocator<std::pair<const_pbrt::FatVertex,_int>_>_>
                *)in_stack_fffffffffffffe58);
    bVar4 = std::operator==(&local_b0,&local_b8);
    if (bVar4) {
      peVar5 = std::__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b6378);
      sVar6 = std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::size
                        (&peVar5->vertex);
      local_bc = (mapped_type)sVar6;
      std::__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1b6398);
      peVar5 = std::__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b63ae);
      std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator[]
                (&peVar5->vertex,local_80);
      std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::push_back
                ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
                 in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      std::__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1b63de);
      bVar4 = std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::empty
                        ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
                         in_stack_fffffffffffffe70);
      if (!bVar4) {
        std::__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1b6402);
        peVar5 = std::__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1b641a);
        std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::operator[]
                  (&peVar5->normal,local_80);
        std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::push_back
                  ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
                   in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      }
      mVar1 = local_bc;
      pmVar8 = std::
               map<pbrt::FatVertex,_int,_std::less<pbrt::FatVertex>,_std::allocator<std::pair<const_pbrt::FatVertex,_int>_>_>
               ::operator[]((map<pbrt::FatVertex,_int,_std::less<pbrt::FatVertex>,_std::allocator<std::pair<const_pbrt::FatVertex,_int>_>_>
                             *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                            in_stack_fffffffffffffe98);
      mVar2 = local_bc;
      *pmVar8 = mVar1;
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,local_80);
      *pvVar10 = mVar2;
    }
    else {
      ppVar9 = std::_Rb_tree_iterator<std::pair<const_pbrt::FatVertex,_int>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_pbrt::FatVertex,_int>_> *)0x1b651b);
      in_stack_fffffffffffffea4 = ppVar9->second;
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,local_80);
      *pvVar10 = in_stack_fffffffffffffea4;
    }
    local_80 = local_80 + 1;
  }
  peVar5 = std::__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1b6565);
  local_c8 = &peVar5->index;
  local_d0._M_current =
       (vec4i *)std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>::begin
                          ((vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_> *)
                           in_stack_fffffffffffffe58);
  local_d8 = (vec4i *)std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>::end
                                ((vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_> *)
                                 in_stack_fffffffffffffe58);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      ((__normal_iterator<pbrt::math::vec4i_*,_std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>_>
                        *)in_stack_fffffffffffffe60,
                       (__normal_iterator<pbrt::math::vec4i_*,_std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>_>
                        *)in_stack_fffffffffffffe58);
    if (!bVar4) break;
    pvVar11 = __gnu_cxx::
              __normal_iterator<pbrt::math::vec4i_*,_std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>_>
              ::operator*(&local_d0);
    local_e8._0_4_ = pvVar11->x;
    local_e8._4_4_ = pvVar11->y;
    local_e0._0_4_ = pvVar11->z;
    local_e0._4_4_ = pvVar11->w;
    std::__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1b65ec);
    if ((int)local_e8 < 0) {
      local_16c = -1;
    }
    else {
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)(int)local_e8);
      local_16c = *pvVar10;
    }
    if (local_e8 < 0) {
      y = -1;
    }
    else {
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)local_e8._4_4_);
      y = *pvVar10;
    }
    if ((int)local_e0 < 0) {
      z = -1;
    }
    else {
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)(int)local_e0);
      z = *pvVar10;
    }
    if (local_e0 < 0) {
      w = -1;
    }
    else {
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)local_e0._4_4_);
      w = *pvVar10;
    }
    math::vec4i::vec4i(&local_f8,local_16c,y,z,w);
    std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>::push_back
              ((vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_> *)
               in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    __gnu_cxx::
    __normal_iterator<pbrt::math::vec4i_*,_std::vector<pbrt::math::vec4i,_std::allocator<pbrt::math::vec4i>_>_>
    ::operator++(&local_d0);
  }
  this = std::operator<<((ostream *)&std::cout,"#pbrt:semantic: done remapping quad mesh. #verts: ")
  ;
  peVar5 = std::__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1b673e);
  sVar6 = std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::size(&peVar5->vertex);
  poVar12 = (ostream *)std::ostream::operator<<(this,sVar6);
  poVar12 = std::operator<<(poVar12," -> ");
  peVar5 = std::__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1b6783);
  sVar6 = std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::size(&peVar5->vertex);
  this_00 = (void *)std::ostream::operator<<(poVar12,sVar6);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  local_11 = 1;
  std::
  map<pbrt::FatVertex,_int,_std::less<pbrt::FatVertex>,_std::allocator<std::pair<const_pbrt::FatVertex,_int>_>_>
  ::~map((map<pbrt::FatVertex,_int,_std::less<pbrt::FatVertex>,_std::allocator<std::pair<const_pbrt::FatVertex,_int>_>_>
          *)0x1b67c9);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
  _Var13._M_pi = extraout_RDX;
  if ((local_11 & 1) == 0) {
    std::shared_ptr<pbrt::QuadMesh>::~shared_ptr((shared_ptr<pbrt::QuadMesh> *)0x1b67ed);
    _Var13._M_pi = extraout_RDX_00;
  }
  SVar14.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var13._M_pi;
  SVar14.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (SP)SVar14.super___shared_ptr<pbrt::QuadMesh,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QuadMesh::SP remeshVertices(QuadMesh::SP in)
  {
    QuadMesh::SP out = std::make_shared<QuadMesh>(in->material);
    out->textures = in->textures;

    std::vector<int> indexRemap(in->vertex.size());
    std::map<FatVertex,int> vertexID;
    for (size_t i=0;i<in->vertex.size();i++) {
      FatVertex oldVertex;
      oldVertex.p = in->vertex[i];
      oldVertex.n = in->normal.empty()?vec3f(0.f):in->normal[i];

      auto it = vertexID.find(oldVertex);
      if (it == vertexID.end()) {
        int newID = (int)out->vertex.size();
        out->vertex.push_back(in->vertex[i]);
        if (!in->normal.empty())
          out->normal.push_back(in->normal[i]);
        // if (!in->texcoord.empty())
        //   out->texcoord.push_back(in->texcoord[i]);
        vertexID[oldVertex] = newID;
        indexRemap[i] = newID;
      } else {
        indexRemap[i] = it->second;
      }
    }
    for (auto idx : in->index) 
      out->index.push_back(vec4i(idx.x < 0 ? -1 : indexRemap[idx.x],
                                 idx.y < 0 ? -1 : indexRemap[idx.y],
                                 idx.z < 0 ? -1 : indexRemap[idx.z],
                                 idx.w < 0 ? -1 : indexRemap[idx.w]));
    std::cout << "#pbrt:semantic: done remapping quad mesh. #verts: " << in->vertex.size() << " -> " << out->vertex.size() << std::endl;
    return out;
  }